

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

int vt_tag_cb(void *sysdata,void *userdata)

{
  int *piVar1;
  ushort uVar2;
  short *psVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  prf_state_t *state;
  ulong uVar8;
  
  psVar3 = *(short **)((long)sysdata + 8);
  iVar6 = 2;
  if ((*(byte *)(psVar3 + 2) & 1) == 0) {
    iVar6 = 1;
    if ((*psVar3 == 0x59) || (*psVar3 == 0x48)) {
      uVar2 = psVar3[1];
      if (7 < uVar2) {
        lVar4 = *(long *)(psVar3 + 4);
        iVar7 = uVar2 - 1;
        if (-1 < (int)(uVar2 - 4)) {
          iVar7 = uVar2 - 4;
        }
        iVar6 = 1;
        uVar5 = iVar7 >> 2;
        if (iVar7 >> 2 < 2) {
          uVar5 = 1;
        }
        uVar8 = 0;
        do {
          piVar1 = (int *)((long)userdata + (ulong)*(uint *)(lVar4 + uVar8 * 4));
          *piVar1 = *piVar1 + 1;
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
    }
  }
  return iVar6;
}

Assistant:

static
int
vt_tag_cb(
    void * sysdata,
    void * userdata )
{
    prf_state_t * state = (prf_state_t *) sysdata;
    uint8_t * rlt = (uint8_t *) userdata;
    prf_node_t * node = state->node;

    if ( node->flags & PRF_NODE_DELETED )
        return PRF_TRAV_SIBLING;

    switch ( node->opcode ) {
    case 72: /* vertex list */
    case 89: /* morph vertex list */
        do {
            int i, num;
            uint32_t * data;
            data = (uint32_t *) node->data;
            num = (node->length - 4) / 4;
            for ( i = 0; i < num; i++ )
                ((uint32_t *)(rlt + data[i]))[0] += 1;
        } while ( FALSE );
        break;
    default:
        break;
    }
    return PRF_TRAV_CONTINUE;
}